

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackIFWGenerator::GetComponentPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,cmCPackComponent *component)

{
  cmCPackIFWPackage *pcVar1;
  char *__s;
  __type local_203;
  bool local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  byte local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  byte local_13a;
  byte local_139;
  undefined1 local_138 [6];
  bool dot;
  cmCPackIFWPackage *local_118;
  cmCPackIFWPackage *package_1;
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  char *local_c8;
  char *option;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string prefix;
  cmCPackIFWPackage *package;
  undefined1 local_40 [8];
  string name;
  cmCPackComponent *component_local;
  cmCPackIFWGenerator *this_local;
  
  name.field_2._8_8_ = component;
  std::__cxx11::string::string((string *)local_40);
  if (name.field_2._8_8_ == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
    goto LAB_0017fbf0;
  }
  pcVar1 = GetComponentPackage(this,(cmCPackComponent *)name.field_2._8_8_);
  if (pcVar1 != (cmCPackIFWPackage *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pcVar1->Name);
    goto LAB_0017fbf0;
  }
  cmsys::SystemTools::UpperCase((string *)&option,(string *)name.field_2._8_8_);
  std::operator+(&local_a0,"CPACK_IFW_COMPONENT_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &local_a0,"_");
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&option);
  std::operator+(&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 "NAME");
  __s = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  package_1._6_1_ = 0;
  local_c8 = __s;
  if (__s == (char *)0x0) {
    std::__cxx11::string::string(local_108,(string *)name.field_2._8_8_);
  }
  else {
    std::allocator<char>::allocator();
    package_1._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_108,__s,(allocator<char> *)((long)&package_1 + 7));
  }
  std::__cxx11::string::operator=((string *)local_40,local_108);
  std::__cxx11::string::~string(local_108);
  if ((package_1._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&package_1 + 7));
  }
  if (*(long *)(name.field_2._8_8_ + 0x40) == 0) {
LAB_0017fbc3:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  else {
    local_118 = GetGroupPackage(this,*(cmCPackComponentGroup **)(name.field_2._8_8_ + 0x40));
    local_139 = 0;
    local_1f1 = true;
    if ((this->super_cmCPackGenerator).componentPackageMethod != ONE_PACKAGE_PER_GROUP) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     "COMMON");
      local_139 = 1;
      local_1f1 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_138);
    }
    if ((local_139 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_138);
    }
    if (local_1f1 == false) {
      local_13a = (this->ResolveDuplicateNames ^ 0xffU) & 1;
      local_161 = 0;
      local_203 = false;
      if (local_13a != 0) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&local_160,(ulong)local_40);
        local_161 = 1;
        local_203 = std::operator==(&local_160,&local_118->Name);
      }
      if ((local_161 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_160);
      }
      if (local_203 != false) {
        local_13a = 0;
      }
      if ((local_13a & 1) != 0) {
        std::operator+(&local_1a8,&local_118->Name,".");
        std::operator+(&local_188,&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::__cxx11::string::operator=((string *)local_40,(string *)&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      goto LAB_0017fbc3;
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_118->Name);
  }
  std::__cxx11::string::~string((string *)local_80);
LAB_0017fbf0:
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetComponentPackageName(
  cmCPackComponent* component) const
{
  std::string name;
  if (!component) {
    return name;
  }
  if (cmCPackIFWPackage* package = this->GetComponentPackage(component)) {
    return package->Name;
  }
  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";
  const char* option = this->GetOption(prefix + "NAME");
  name = option ? option : component->Name;
  if (component->Group) {
    cmCPackIFWPackage* package = this->GetGroupPackage(component->Group);
    if ((this->componentPackageMethod ==
         cmCPackGenerator::ONE_PACKAGE_PER_GROUP) ||
        this->IsOn(prefix + "COMMON")) {
      return package->Name;
    }
    bool dot = !this->ResolveDuplicateNames;
    if (dot && name.substr(0, package->Name.size()) == package->Name) {
      dot = false;
    }
    if (dot) {
      name = package->Name + "." + name;
    }
  }
  return name;
}